

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<long,std::allocator<long>>::insert_impl<unsigned_int,bk_lib::detail::Fill<long>>
          (pod_vector<long,_std::allocator<long>_> *this,iterator pos,uint n,Fill<long> *pred)

{
  size_type sVar1;
  uint uVar2;
  long *__dest;
  iterator plVar3;
  ulong uVar4;
  uint in_EDX;
  ebo *in_RSI;
  new_allocator<long> *in_RDI;
  const_pointer buf;
  size_type prefix;
  pointer temp;
  size_type new_cap;
  long *in_stack_ffffffffffffff98;
  long *__dest_00;
  ebo *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  ebo *peVar5;
  undefined4 in_stack_ffffffffffffffb8;
  pod_vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffc0;
  
  sVar1 = pod_vector<long,_std::allocator<long>_>::size
                    ((pod_vector<long,_std::allocator<long>_> *)in_RDI);
  uVar2 = sVar1 + in_EDX;
  sVar1 = pod_vector<long,_std::allocator<long>_>::capacity
                    ((pod_vector<long,_std::allocator<long>_> *)in_RDI);
  if (sVar1 < uVar2) {
    sVar1 = pod_vector<long,_std::allocator<long>_>::grow_size
                      ((pod_vector<long,_std::allocator<long>_> *)in_RDI,
                       (size_type)(in_stack_ffffffffffffffa8 >> 0x20));
    __dest = __gnu_cxx::new_allocator<long>::allocate
                       (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    peVar5 = in_RSI;
    plVar3 = pod_vector<long,_std::allocator<long>_>::begin
                       ((pod_vector<long,_std::allocator<long>_> *)in_RDI);
    uVar4 = (long)peVar5 - (long)plVar3 >> 3;
    plVar3 = pod_vector<long,_std::allocator<long>_>::begin
                       ((pod_vector<long,_std::allocator<long>_> *)in_RDI);
    if (plVar3 != (iterator)0x0) {
      memcpy(__dest,plVar3,(uVar4 & 0xffffffff) << 3);
    }
    detail::Fill<long>::operator()
              ((Fill<long> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1b9a90);
    if (in_RSI != (ebo *)0x0) {
      __dest_00 = __dest + (uVar4 & 0xffffffff) + (ulong)in_EDX;
      in_stack_ffffffffffffffa0 = in_RSI;
      plVar3 = pod_vector<long,_std::allocator<long>_>::end
                         ((pod_vector<long,_std::allocator<long>_> *)in_RDI);
      memcpy(__dest_00,in_stack_ffffffffffffffa0,((long)plVar3 - (long)in_RSI >> 3) << 3);
    }
    pod_vector<long,_std::allocator<long>_>::ebo::release(in_stack_ffffffffffffffa0);
    *(long **)in_RDI = __dest;
    *(uint *)(in_RDI + 8) = in_EDX + *(int *)(in_RDI + 8);
    *(size_type *)(in_RDI + 0xc) = sVar1;
  }
  else {
    pod_vector<long,_std::allocator<long>_>::move_right
              (in_stack_ffffffffffffffc0,(iterator)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
               (size_type)((ulong)in_RDI >> 0x20));
    detail::Fill<long>::operator()
              ((Fill<long> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1b99da);
    *(uint *)(in_RDI + 8) = in_EDX + *(size_type *)(in_RDI + 8);
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}